

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::MinMaxState<unsigned_long>,unsigned_long,duckdb::MinOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  ulong *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  idx_t iVar13;
  idx_t iVar14;
  ulong uVar15;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      pdVar5 = input->data;
      pdVar6 = states->data;
      FlatVector::VerifyFlatVector(input);
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        if (count == 0) {
          return;
        }
        iVar12 = 0;
        do {
          puVar2 = *(ulong **)(pdVar6 + iVar12 * 8);
          uVar10 = *(ulong *)(pdVar5 + iVar12 * 8);
          if ((char)puVar2[1] == '\0') {
            *puVar2 = uVar10;
            *(undefined1 *)(puVar2 + 1) = 1;
          }
          else if (uVar10 < *puVar2) {
            *puVar2 = uVar10;
          }
          iVar12 = iVar12 + 1;
        } while (count != iVar12);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar8 = 0;
      uVar10 = 0;
      do {
        uVar7 = puVar1[uVar8];
        uVar9 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar9 = count;
        }
        uVar11 = uVar9;
        if (uVar7 != 0) {
          uVar11 = uVar10;
          if (uVar7 == 0xffffffffffffffff) {
            if (uVar10 < uVar9) {
              do {
                puVar2 = *(ulong **)(pdVar6 + uVar10 * 8);
                uVar7 = *(ulong *)(pdVar5 + uVar10 * 8);
                if ((char)puVar2[1] == '\0') {
                  *puVar2 = uVar7;
                  *(undefined1 *)(puVar2 + 1) = 1;
                }
                else if (uVar7 < *puVar2) {
                  *puVar2 = uVar7;
                }
                uVar10 = uVar10 + 1;
                uVar11 = uVar9;
              } while (uVar9 != uVar10);
            }
          }
          else if (uVar10 < uVar9) {
            uVar15 = 0;
            do {
              if ((uVar7 >> (uVar15 & 0x3f) & 1) != 0) {
                puVar2 = *(ulong **)(pdVar6 + uVar15 * 8 + uVar10 * 8);
                uVar11 = *(ulong *)(pdVar5 + uVar15 * 8 + uVar10 * 8);
                if ((char)puVar2[1] == '\0') {
                  *puVar2 = uVar11;
                  *(undefined1 *)(puVar2 + 1) = 1;
                }
                else if (uVar11 < *puVar2) {
                  *puVar2 = uVar11;
                }
              }
              uVar15 = uVar15 + 1;
              uVar11 = uVar9;
            } while (uVar9 - uVar10 != uVar15);
          }
        }
        uVar8 = uVar8 + 1;
        uVar10 = uVar11;
      } while (uVar8 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      return;
    }
    puVar2 = *(ulong **)states->data;
    uVar10 = *(ulong *)input->data;
    if ((char)puVar2[1] == '\0') {
      *puVar2 = uVar10;
      *(undefined1 *)(puVar2 + 1) = 1;
      return;
    }
    if (*puVar2 <= uVar10) {
      return;
    }
    *puVar2 = uVar10;
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  Vector::ToUnifiedFormat(input,count,&local_b8);
  Vector::ToUnifiedFormat(states,count,&local_70);
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar3 = (local_b8.sel)->sel_vector;
      psVar4 = (local_70.sel)->sel_vector;
      iVar12 = 0;
      do {
        iVar13 = iVar12;
        if (psVar3 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar3[iVar12];
        }
        iVar14 = iVar12;
        if (psVar4 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar4[iVar12];
        }
        puVar2 = *(ulong **)(local_70.data + iVar14 * 8);
        uVar10 = *(ulong *)(local_b8.data + iVar13 * 8);
        if ((char)puVar2[1] == '\0') {
          *puVar2 = uVar10;
          *(undefined1 *)(puVar2 + 1) = 1;
        }
        else if (uVar10 < *puVar2) {
          *puVar2 = uVar10;
        }
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
    }
  }
  else if (count != 0) {
    psVar3 = (local_b8.sel)->sel_vector;
    psVar4 = (local_70.sel)->sel_vector;
    iVar12 = 0;
    do {
      iVar13 = iVar12;
      if (psVar3 != (sel_t *)0x0) {
        iVar13 = (idx_t)psVar3[iVar12];
      }
      iVar14 = iVar12;
      if (psVar4 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar4[iVar12];
      }
      if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar13 >> 6]
           >> (iVar13 & 0x3f) & 1) != 0) {
        puVar2 = *(ulong **)(local_70.data + iVar14 * 8);
        uVar10 = *(ulong *)(local_b8.data + iVar13 * 8);
        if ((char)puVar2[1] == '\0') {
          *puVar2 = uVar10;
          *(undefined1 *)(puVar2 + 1) = 1;
        }
        else if (uVar10 < *puVar2) {
          *puVar2 = uVar10;
        }
      }
      iVar12 = iVar12 + 1;
    } while (count != iVar12);
  }
  if (local_70.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}